

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.h
# Opt level: O1

bool __thiscall
SQCompilation::NodeEqualChecker::cmpIncExpr(NodeEqualChecker *this,IncExpr *l,IncExpr *r)

{
  bool bVar1;
  
  if ((l->_form == r->_form) && (l->_diff == r->_diff)) {
    bVar1 = check(this,&l->_arg->super_Node,&r->_arg->super_Node);
    return bVar1;
  }
  return false;
}

Assistant:

int diff() const { return _diff; }